

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

bool __thiscall QHostAddress::setAddress(QHostAddress *this,QString *address)

{
  QHostAddressPrivate *pQVar1;
  bool bVar2;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QHostAddressPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QExplicitlySharedDataPointer<QHostAddressPrivate>::detach_helper(&this->d);
  }
  bVar2 = QHostAddressPrivate::parse((this->d).d.ptr,address);
  return bVar2;
}

Assistant:

bool QHostAddress::setAddress(const QString &address)
{
    d.detach();
    return d->parse(address);
}